

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O0

void anon_unknown.dwarf_114bc3::doReadWriteManifest(IDManifest *mfst,string *fn,bool dump)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  Header *pHVar4;
  ostream *poVar5;
  CompressedIDManifest *pCVar6;
  ulong uVar7;
  undefined8 uVar8;
  vector<char,_std::allocator<char>_> *pvVar9;
  byte in_DL;
  IDManifest *in_RDI;
  vector<char,_std::allocator<char>_> compressed;
  size_t compressedDataSize;
  size_t sourceDataSize;
  ostringstream str;
  IDManifest read;
  CompressedIDManifest *cmpd;
  InputFile in;
  Header h;
  allocator_type *in_stack_fffffffffffffcb0;
  size_type in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffd38;
  Vec2<float> *this;
  string local_2b8 [39];
  allocator<char> local_291 [25];
  vector<char,_std::allocator<char>_> *local_278;
  string local_270 [24];
  string *in_stack_fffffffffffffda8;
  Header *in_stack_fffffffffffffdb0;
  string local_248 [32];
  ostringstream local_228 [376];
  IDManifest local_b0;
  int *local_98;
  InputFile local_90 [32];
  CompressedIDManifest local_70 [24];
  Vec2<float> local_58;
  Header local_50 [63];
  byte local_11;
  IDManifest *local_8;
  
  local_11 = in_DL & 1;
  this = &local_58;
  local_8 = in_RDI;
  Imath_3_2::Vec2<float>::Vec2(this,0.0,0.0);
  Imf_3_2::Header::Header(local_50,0x40,0x40,1.0,(Vec2 *)this,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_2::CompressedIDManifest::CompressedIDManifest(local_70,local_8);
  Imf_3_2::addIDManifest(local_50,local_70);
  Imf_3_2::CompressedIDManifest::~CompressedIDManifest(local_70);
  writeFile(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  iVar2 = Imf_3_2::globalThreadCount();
  Imf_3_2::InputFile::InputFile(local_90,pcVar3,iVar2);
  pHVar4 = (Header *)Imf_3_2::InputFile::header();
  local_98 = (int *)Imf_3_2::idManifest(pHVar4);
  poVar5 = std::operator<<((ostream *)&std::cerr,"compression: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(ulong *)(local_98 + 2));
  poVar5 = std::operator<<(poVar5," --> ");
  std::ostream::operator<<(poVar5,*local_98);
  std::ostream::flush();
  pHVar4 = (Header *)Imf_3_2::InputFile::header();
  pCVar6 = (CompressedIDManifest *)Imf_3_2::idManifest(pHVar4);
  Imf_3_2::IDManifest::IDManifest(&local_b0,pCVar6);
  std::__cxx11::ostringstream::ostringstream(local_228);
  operator<<((ostream *)this,(IDManifest *)CONCAT44(iVar2,in_stack_fffffffffffffd38));
  poVar5 = std::operator<<((ostream *)&std::cerr," raw decoded size: ");
  std::__cxx11::ostringstream::str();
  uVar7 = std::__cxx11::string::size();
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar7);
  std::operator<<(poVar5,' ');
  std::__cxx11::string::~string(local_248);
  std::__cxx11::ostringstream::str();
  uVar8 = std::__cxx11::string::size();
  std::__cxx11::string::~string(local_270);
  pvVar9 = (vector<char,_std::allocator<char>_> *)exr_compress_max_buffer_size(uVar8);
  local_278 = pvVar9;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (pvVar9,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  std::allocator<char>::~allocator(local_291);
  std::__cxx11::ostringstream::str();
  pvVar9 = (vector<char,_std::allocator<char>_> *)std::__cxx11::string::c_str();
  pcVar3 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x1c53d4);
  exr_compress_buffer(6,pvVar9,uVar8,pcVar3,local_278,&local_278);
  std::__cxx11::string::~string(local_2b8);
  poVar5 = std::operator<<((ostream *)&std::cerr,"simple zip size: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)local_278);
  std::operator<<(poVar5,' ');
  std::ostream::flush();
  if ((local_11 & 1) != 0) {
    operator<<((ostream *)this,(IDManifest *)CONCAT44(iVar2,in_stack_fffffffffffffd38));
  }
  bVar1 = Imf_3_2::IDManifest::operator!=(&local_b0,local_8);
  if ((bVar1 & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"read manifest didn\'t match written manifest\n");
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  remove(pcVar3);
  std::vector<char,_std::allocator<char>_>::~vector(pvVar9);
  std::__cxx11::ostringstream::~ostringstream(local_228);
  Imf_3_2::IDManifest::~IDManifest((IDManifest *)0x1c5612);
  Imf_3_2::InputFile::~InputFile(local_90);
  Imf_3_2::Header::~Header(local_50);
  return;
}

Assistant:

void
doReadWriteManifest (const IDManifest& mfst, const string& fn, bool dump)
{
    Header h;
    addIDManifest (h, mfst);
    writeFile (h, fn);

    InputFile in (fn.c_str ());

    const CompressedIDManifest& cmpd = idManifest (in.header ());
    cerr << "compression: " << cmpd._uncompressedDataSize << " --> "
         << cmpd._compressedDataSize;
    cerr.flush ();

    IDManifest read = idManifest (in.header ());

    std::ostringstream str;
    str << read;

    cerr << " raw decoded size: " << str.str ().size () << ' ';

#define COMPARE_WITH_SIMPLE_ZIP
#ifdef COMPARE_WITH_SIMPLE_ZIP
    //
    // allocate a buffer which is guaranteed to be big enough for compression
    //
    size_t       sourceDataSize = str.str ().size ();
    size_t       compressedDataSize = exr_compress_max_buffer_size (sourceDataSize);
    vector<char> compressed (compressedDataSize);

    exr_compress_buffer (
        6,
        str.str ().c_str (),
        sourceDataSize,
        compressed.data (),
        compressedDataSize,
        &compressedDataSize);

    cerr << "simple zip size: " << compressedDataSize << ' ';
#endif

    cerr.flush ();
    if (dump) { cout << read; }
    if (read != mfst)
    {
        cerr << "read manifest didn't match written manifest\n";
        assert (read == mfst);
    }
    remove (fn.c_str ());
}